

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFurnitureType::~IfcFurnitureType(IfcFurnitureType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x976f50;
  *(undefined8 *)&this->field_0x30 = 0x977068;
  *(undefined8 *)&this[-1].field_0xd0 = 0x976f78;
  *(undefined8 *)&this[-1].field_0xe0 = 0x976fa0;
  *(undefined8 *)&this[-1].field_0x138 = 0x976fc8;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x976ff0;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x977018;
  *(undefined8 *)this = 0x977040;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x977330;
  *(undefined8 *)&this->field_0x30 = 0x9773f8;
  *(undefined8 *)&this[-1].field_0xd0 = 0x977358;
  *(undefined8 *)&this[-1].field_0xe0 = 0x977380;
  *(undefined8 *)&this[-1].field_0x138 = 0x9773a8;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x9773d0;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>.
                 field_0x20) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__00977090);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcFurnitureType() : Object("IfcFurnitureType") {}